

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_item.cpp
# Opt level: O3

void menu_item_draw_proc(Am_Object *self,Am_Drawonable *draw,int x_offset,int y_offset)

{
  uint *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int width;
  int iVar10;
  uint uVar11;
  int iVar12;
  Am_Value *pAVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar17;
  char *pcVar18;
  size_t sVar19;
  Am_Wrapper *pAVar20;
  ostream *poVar21;
  Am_Style *prev;
  uint top;
  Am_Style text_style;
  Am_Widget_Look look;
  Am_Object obj;
  Am_String accel_string;
  Am_String string;
  Computed_Colors_Record local_90;
  Am_Font font;
  int str_width;
  Am_Value value;
  Am_Object local_60;
  int b;
  int a;
  int descent;
  int ascent;
  Am_Value accel_value;
  Am_Image_Array local_38;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar22;
  
  pAVar13 = Am_Object::Get(self,100,0);
  iVar8 = Am_Value::operator_cast_to_int(pAVar13);
  pAVar13 = Am_Object::Get(self,0x65,0);
  iVar9 = Am_Value::operator_cast_to_int(pAVar13);
  pAVar13 = Am_Object::Get(self,0x66,0);
  width = Am_Value::operator_cast_to_int(pAVar13);
  uVar14 = CONCAT44(extraout_var,width);
  pAVar13 = Am_Object::Get(self,0x67,0);
  iVar10 = Am_Value::operator_cast_to_int(pAVar13);
  uVar15 = CONCAT44(extraout_var_00,iVar10);
  pAVar13 = Am_Object::Get(self,0x172,0);
  bVar3 = Am_Value::operator_cast_to_bool(pAVar13);
  pAVar13 = Am_Object::Get(self,0x173,0);
  bVar4 = Am_Value::operator_cast_to_bool(pAVar13);
  pAVar13 = Am_Object::Get(self,0xcc,0);
  bVar5 = Am_Value::operator_cast_to_bool(pAVar13);
  pAVar13 = Am_Object::Get(self,0x17b,0);
  bVar6 = Am_Value::operator_cast_to_bool(pAVar13);
  pAVar13 = Am_Object::Get(self,0xac,0);
  Am_Font::Am_Font(&font,pAVar13);
  pAVar13 = Am_Object::Get(self,0x1ad,0);
  local_90.data = (Computed_Colors_Record_Data *)(pAVar13->value).wrapper_value;
  if (local_90.data != (Computed_Colors_Record_Data *)0x0) {
    puVar1 = &((local_90.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  pAVar13 = Am_Object::Get(self,0x17f,0);
  look.value = Am_MOTIF_LOOK_val;
  if ((pAVar13->type != 1) && (pAVar13->type != Am_Widget_Look::Am_Widget_Look_ID)) {
    Am_Widget_Look::TypeError(&look,pAVar13);
  }
  look.value = (Am_Widget_Look_vals)(pAVar13->value).float_value;
  pAVar13 = Am_Object::Get(self,0x1ab,3);
  bVar7 = Am_Value::Valid(pAVar13);
  string.data = (Am_String_Data *)0x0;
  obj.data = (Am_Object_Data *)0x0;
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar13 = Am_Object::Get(self,0x1ae,1);
  Am_Value::operator=(&value,pAVar13);
  if (value.type < 0x8008) {
    bVar2 = true;
    if ((value.type != 2) && (value.type != 4)) {
LAB_0026aed6:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"String slot of widget ",0x16);
      poVar21 = operator<<((ostream *)&std::cerr,self);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar21," should have string or object type, but value is ",0x31);
      poVar21 = operator<<(poVar21,&value);
      std::endl<char,std::char_traits<char>>(poVar21);
      Am_Error();
    }
  }
  else {
    if (value.type == 0x8008) {
      Am_String::operator=(&string,&value);
    }
    else {
      if (value.type != 0xa001) goto LAB_0026aed6;
      Am_Object::operator=(&obj,&value);
    }
    bVar2 = false;
  }
  accel_string.data = (Am_String_Data *)0x0;
  accel_value.type = 0;
  accel_value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar13 = Am_Object::Get(self,0x1e1,1);
  Am_Value::operator=(&accel_value,pAVar13);
  if (accel_value.type == 0x8008) {
    Am_String::operator=(&accel_string,&accel_value);
  }
  uVar11 = iVar8 + x_offset;
  uVar16 = (ulong)uVar11;
  top = iVar9 + y_offset;
  uVar22 = (ulong)top;
  if (bVar2) {
    if (look.value == Am_MACINTOSH_LOOK_val) {
      Am_Image_Array::Am_Image_Array(&local_38,&Am_No_Image);
      Am_Style::Am_Style(&text_style,"grey",1,Am_CAP_BUTT,Am_JOIN_MITER,Am_LINE_SOLID,"\x04\x04",2,
                         Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,(Am_Image_Array_Data *)&local_38);
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&text_style,uVar16,(ulong)(top + 8),(ulong)((width + uVar11) - 1),
                 (ulong)(top + 8),0);
      Am_Style::~Am_Style(&text_style);
      Am_Image_Array::~Am_Image_Array(&local_38);
    }
    else {
      if (look.value == Am_WINDOWS_LOOK_val) {
        uVar11 = (width + uVar11) - 1;
        iVar8 = 4;
        (*draw->_vptr_Am_Drawonable[0x28])
                  (draw,&(local_90.data)->background_style,uVar16,(ulong)(top + 3),(ulong)uVar11,
                   (ulong)(top + 3),0);
      }
      else {
        if (look.value != Am_MOTIF_LOOK_val) {
LAB_0026aeca:
          Am_Error("Unknown Look parameter");
        }
        uVar11 = (width + uVar11) - 1;
        iVar8 = 1;
        (*draw->_vptr_Am_Drawonable[0x28])
                  (draw,&(local_90.data)->shadow_style,uVar16,uVar22,(ulong)uVar11,(ulong)top,0);
      }
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&(local_90.data)->highlight_style,uVar16,(ulong)(top + iVar8),(ulong)uVar11,
                 (ulong)(top + iVar8),0);
    }
    goto LAB_0026ae64;
  }
  if (bVar6 && bVar3 || bVar4) {
    if (look.value == Am_MACINTOSH_LOOK_val) {
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&Am_No_Style,&Am_Black,uVar16,(ulong)top,uVar14,uVar15,0);
    }
    else if (look.value == Am_WINDOWS_LOOK_val) {
      pAVar13 = Am_Object::Get(self,0x1c9,0);
      Am_Style::Am_Style(&text_style,pAVar13);
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&Am_No_Style,&text_style,uVar16,(ulong)top,uVar14,uVar15,0);
      Am_Style::~Am_Style(&text_style);
    }
    else {
      if (look.value != Am_MOTIF_LOOK_val) goto LAB_0026aeca;
      Am_Draw_Motif_Box(uVar11,top,width,iVar10,false,&local_90,draw);
    }
  }
  pAVar13 = Am_Object::Get(self,0x1cd,0);
  iVar8 = Am_Value::operator_cast_to_int(pAVar13);
  pAVar13 = Am_Object::Get(self,0x1cb,0);
  iVar9 = Am_Value::operator_cast_to_int(pAVar13);
  if (bVar7) {
    (*draw->_vptr_Am_Drawonable[0x21])(draw,uVar16,(ulong)top,uVar14,uVar15);
    Am_Style::Am_Style(&text_style,&Am_Line_2);
    if (bVar5) {
      if ((bVar6 && bVar3 || bVar4) && look.value == Am_MACINTOSH_LOOK_val) {
        prev = &am_white_2;
        goto LAB_0026aa05;
      }
    }
    else {
      prev = &am_grey_2;
LAB_0026aa05:
      Am_Style::operator=(&text_style,prev);
    }
    iVar12 = 0x10;
    if (iVar10 < 0x10) {
      iVar12 = iVar10;
    }
    (*draw->_vptr_Am_Drawonable[0x2a])
              (draw,&text_style,&Am_No_Style,(ulong)(uVar11 + 2),
               (ulong)(((int)(((uint)(uVar15 >> 0x1f) & 1) + iVar10) >> 1) + top),
               (ulong)(uVar11 + 5),(ulong)((iVar12 + iVar10 + -4) / 2 + top),(ulong)(uVar11 + 10),
               (ulong)((iVar10 - (iVar12 + -4)) / 2 + top),0);
    (*draw->_vptr_Am_Drawonable[0x22])(draw);
    Am_Style::~Am_Style(&text_style);
  }
  compute_text_style(SUB81(&text_style,0),bVar5,
                     (Computed_Colors_Record *)(ulong)(bVar6 && bVar3 || bVar4),
                     (Am_Widget_Look)(Am_Widget_Look_vals)&local_90,look.value);
  pcVar17 = Am_String::operator_cast_to_char_(&string);
  if (pcVar17 == (char *)0x0) {
    bVar5 = Am_Object::Valid(&obj);
    if (bVar5) {
      pAVar13 = Am_Object::Get(&obj,100,0);
      iVar10 = Am_Value::operator_cast_to_int(pAVar13);
      pAVar13 = Am_Object::Get(&obj,0x65,0);
      iVar12 = Am_Value::operator_cast_to_int(pAVar13);
      if ((bVar3 || bVar4) && (look.value == Am_MACINTOSH_LOOK.value)) {
        pAVar13 = Am_Object::Get(&obj,0x6b,1);
        bVar3 = Am_Value::Exists(pAVar13);
        if (!bVar3) goto LAB_0026acba;
        pAVar13 = Am_Object::Get(&obj,0x6b,0);
        pAVar20 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
        bVar3 = Am_Value::operator==(pAVar13,pAVar20);
        if (!bVar3) goto LAB_0026acba;
        pAVar20 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_White);
        bVar3 = true;
        Am_Object::Set(&obj,0x6b,pAVar20,0);
      }
      else {
LAB_0026acba:
        bVar3 = false;
      }
      (*draw->_vptr_Am_Drawonable[0x21])(draw,uVar16,(ulong)top,uVar14,uVar15);
      Am_Object::Am_Object(&local_60,&obj);
      Am_Draw(&local_60,draw,(iVar8 + uVar11) - iVar10,(iVar9 + top) - iVar12);
      Am_Object::~Am_Object(&local_60);
      (*draw->_vptr_Am_Drawonable[0x22])(draw);
      if (bVar3) {
        pAVar20 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
        Am_Object::Set(&obj,0x6b,pAVar20,0);
      }
    }
  }
  else {
    pcVar17 = Am_String::operator_cast_to_char_(&string);
    pcVar18 = Am_String::operator_cast_to_char_(&string);
    sVar19 = strlen(pcVar18);
    (*draw->_vptr_Am_Drawonable[0x1a])
              (draw,&font,pcVar17,sVar19 & 0xffffffff,&str_width,&ascent,&descent,&a,&b);
    (*draw->_vptr_Am_Drawonable[0x21])(draw,uVar16,uVar22,uVar14,uVar15);
    pcVar17 = Am_String::operator_cast_to_char_(&string);
    pcVar18 = Am_String::operator_cast_to_char_(&string);
    sVar19 = strlen(pcVar18);
    (*draw->_vptr_Am_Drawonable[0x2e])
              (draw,&text_style,pcVar17,sVar19 & 0xffffffff,&font,(ulong)(iVar8 + uVar11),
               (ulong)(iVar9 + top),0,&Am_No_Style,0);
    (*draw->_vptr_Am_Drawonable[0x22])(draw);
  }
  pcVar17 = Am_String::operator_cast_to_char_(&accel_string);
  if (pcVar17 != (char *)0x0) {
    pcVar17 = Am_String::operator_cast_to_char_(&accel_string);
    pcVar18 = Am_String::operator_cast_to_char_(&accel_string);
    sVar19 = strlen(pcVar18);
    (*draw->_vptr_Am_Drawonable[0x1a])
              (draw,&font,pcVar17,sVar19 & 0xffffffff,&str_width,&ascent,&descent,&a,&b);
    (*draw->_vptr_Am_Drawonable[0x21])(draw,uVar16,uVar22,uVar14,uVar15);
    pcVar17 = Am_String::operator_cast_to_char_(&accel_string);
    pcVar18 = Am_String::operator_cast_to_char_(&accel_string);
    sVar19 = strlen(pcVar18);
    (*draw->_vptr_Am_Drawonable[0x2e])
              (draw,&text_style,pcVar17,sVar19 & 0xffffffff,&font,
               (ulong)(((width + uVar11) - str_width) - 5),(ulong)(iVar9 + top),0,&Am_No_Style,0);
    (*draw->_vptr_Am_Drawonable[0x22])(draw);
  }
  Am_Style::~Am_Style(&text_style);
LAB_0026ae64:
  Am_Value::~Am_Value(&accel_value);
  Am_String::~Am_String(&accel_string);
  Am_Value::~Am_Value(&value);
  Am_Object::~Am_Object(&obj);
  Am_String::~Am_String(&string);
  if (local_90.data != (Computed_Colors_Record_Data *)0x0) {
    puVar1 = &((local_90.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*((local_90.data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
    }
  }
  Am_Font::~Am_Font(&font);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, menu_item_draw,
                 (Am_Object self, Am_Drawonable *draw, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  bool selected = self.Get(Am_SELECTED);
  bool interim_selected = self.Get(Am_INTERIM_SELECTED);
  bool active = self.Get(Am_ACTIVE);
  bool want_final_selected = self.Get(Am_FINAL_FEEDBACK_WANTED);
  Am_Font font(self.Get(Am_FONT));
  Computed_Colors_Record color_rec = self.Get(Am_STYLE_RECORD);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  bool draw_selected = selected && want_final_selected;
  bool checked = self.Get(Am_CHECKED_ITEM, Am_RETURN_ZERO_ON_ERROR).Valid();

  // now find the contents to draw in the button
  Am_String string;
  Am_Object obj;
  Am_Value value;
  bool line = false;

  // string slot contains a formula which gets the real object based on the
  // value of the COMMAND slot
  value = self.Peek(Am_REAL_STRING_OR_OBJ);

  switch (value.type) {
  case Am_STRING:
    string = value;
    break;

  case Am_OBJECT:
    obj = value;
    break;

  case Am_INT: // ok to fall thru ( Am_INT || Am_BOOL )
  case Am_BOOL:
    line = true;
    break;

  default:
    Am_ERRORO("String slot of widget "
                  << self << " should have string or object type, but value is "
                  << value,
              self, Am_REAL_STRING_OR_OBJ);
  }

  Am_String accel_string;
  Am_Value accel_value;
  accel_value = self.Peek(Am_ACCELERATOR_STRING);
  if (accel_value.type == Am_STRING)
    accel_string = accel_value;

  // let's draw it
  if (line) // if it's just a line, draw it.
  {
    switch (look.value) {
    case Am_MOTIF_LOOK_val:
      draw->Draw_Line(color_rec.data->shadow_style, left, top, left + width - 1,
                      top);
      draw->Draw_Line(color_rec.data->highlight_style, left, top + 1,
                      left + width - 1, top + 1);
      break;

    case Am_WINDOWS_LOOK_val:
      draw->Draw_Line(color_rec.data->background_style, left, top + 3,
                      left + width - 1, top + 3);
      draw->Draw_Line(color_rec.data->highlight_style, left, top + 4,
                      left + width - 1, top + 4);
      break;

    case Am_MACINTOSH_LOOK_val:
      draw->Draw_Line(Am_Style("grey", 1), left, top + 8, left + width - 1,
                      top + 8);
      break;

    default:
      Am_Error("Unknown Look parameter");
      break;
    }
    return;
  }

  if (draw_selected || interim_selected)
    switch (look.value) {
    case Am_MOTIF_LOOK_val:
      Am_Draw_Motif_Box(left, top, width, height, false, color_rec, draw);
      break;

    case Am_WINDOWS_LOOK_val: {
      Am_Style fill_color = self.Get(Am_MENU_SELECTED_COLOR);
      draw->Draw_Rectangle(Am_No_Style, fill_color, left, top, width, height);
      break;
    }

    case Am_MACINTOSH_LOOK_val:
      draw->Draw_Rectangle(Am_No_Style, Am_Black, left, top, width, height);
      break;

    default:
      Am_Error("Unknown Look parameter");
      break;
    }

  int leftOffset = self.Get(Am_MENU_ITEM_LEFT_OFFSET),
      topOffset = self.Get(Am_MENU_ITEM_TOP_OFFSET);

  if (checked) {
    draw->Push_Clip(left, top, width, height);
    Am_Style check_style = Am_Line_2;
    if (!active)
      check_style = am_grey_2;
    else if ((look.value == Am_MACINTOSH_LOOK_val) &&
             (interim_selected || (selected && want_final_selected)))
      check_style = am_white_2;
    int check_height = height - 4;
    if (check_height > 12)
      check_height = 12;
    draw->Draw_2_Lines(check_style, Am_No_Style, left + 2, top + (height / 2),
                       left + 5, top + ((height + check_height) / 2), left + 10,
                       top + ((height - check_height) / 2));
    draw->Pop_Clip();
  }

  // now draw the string if any
  Am_Style text_style =
      compute_text_style(active, draw_selected || interim_selected, color_rec,
                         look, Am_MENU_BUTTON);

  int str_width, ascent, descent, a, b, str_left, str_top;

  if ((const char *)string) {
    draw->Get_String_Extents(font, string, strlen(string), str_width, ascent,
                             descent, a, b);

    // always left justify the text for now
    str_left = left + leftOffset;
    str_top = top + topOffset;

    // set a clip region in case string bigger than the button
    draw->Push_Clip(left, top, width, height);
    // does not correctly clip top and bottom
    draw->Draw_Text(text_style, string, strlen(string), font, str_left,
                    str_top);
    draw->Pop_Clip();
  } else if (obj.Valid()) {
    // left justify the object; since a part of the button, will be offset from
    // buttons' left and top automatically.
    int obj_left = leftOffset;
    int obj_top = topOffset;
    int orig_left = obj.Get(Am_LEFT);
    int orig_top = obj.Get(Am_TOP);

    // call the object's draw method to draw the component
    bool line_changed = false;
    if ((selected || interim_selected) && look == Am_MACINTOSH_LOOK) {
      if (obj.Peek(Am_LINE_STYLE).Exists()) {
        if (obj.Get(Am_LINE_STYLE) == Am_Black) {
          obj.Set(Am_LINE_STYLE, Am_White);
          line_changed = true;
        }
      }
    }

    draw->Push_Clip(left, top, width, height);
    Am_Draw(obj, draw, left - orig_left + obj_left, top - orig_top + obj_top);
    draw->Pop_Clip();

    if (line_changed)
      obj.Set(Am_LINE_STYLE, Am_Black);
  }

  if ((const char *)accel_string) {
    // always right justify the accel text
    draw->Get_String_Extents(font, accel_string, strlen(accel_string),
                             str_width, ascent, descent, a, b);
    str_left = left + width - str_width - 5;
    str_top = top + topOffset;

    // set a clip region in case string bigger than the button
    draw->Push_Clip(left, top, width, height);
    draw->Draw_Text(text_style, accel_string, strlen(accel_string), font,
                    str_left, str_top);
    draw->Pop_Clip();
  }
}